

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_deblk_edge_filter.c
# Opt level: O3

void ihevc_deblk_chroma_horz
               (UWORD8 *pu1_src,WORD32 src_strd,WORD32 quant_param_p,WORD32 quant_param_q,
               WORD32 qp_offset_u,WORD32 qp_offset_v,WORD32 tc_offset_div2,WORD32 filter_flag_p,
               WORD32 filter_flag_q)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  
  if (filter_flag_q != 0 || filter_flag_p != 0) {
    iVar2 = quant_param_q + quant_param_p + 1 >> 1;
    uVar7 = qp_offset_u + iVar2;
    if (-1 < (int)uVar7) {
      if (uVar7 < 0x3a) {
        uVar7 = gai4_ihevc_qp_table[uVar7];
      }
      else {
        uVar7 = uVar7 - 6;
      }
    }
    uVar3 = iVar2 + qp_offset_v;
    if (-1 < (int)uVar3) {
      if (uVar3 < 0x3a) {
        uVar3 = gai4_ihevc_qp_table[uVar3];
      }
      else {
        uVar3 = uVar3 - 6;
      }
    }
    uVar7 = uVar7 + tc_offset_div2 * 2 + 2;
    if ((int)uVar7 < 1) {
      uVar7 = 0;
    }
    uVar8 = (ulong)uVar7;
    if (0x34 < (int)uVar7) {
      uVar8 = 0x35;
    }
    uVar3 = uVar3 + tc_offset_div2 * 2 + 2;
    uVar7 = 0;
    if (0 < (int)uVar3) {
      uVar7 = uVar3;
    }
    if (0x34 < (int)uVar7) {
      uVar7 = 0x35;
    }
    iVar2 = gai4_ihevc_tc_table[uVar8];
    iVar1 = gai4_ihevc_tc_table[uVar7];
    if (iVar2 != 0 || iVar1 != 0) {
      lVar6 = (long)src_strd;
      uVar8 = 0;
      do {
        iVar4 = iVar2;
        if ((uVar8 & 1) != 0) {
          iVar4 = iVar1;
        }
        iVar9 = (int)((((uint)pu1_src[uVar8 + lVar6 * -2] +
                       ((uint)pu1_src[uVar8] - (uint)pu1_src[uVar8 - lVar6]) * 4) -
                      (uint)pu1_src[uVar8 + lVar6]) + 4) >> 3;
        iVar5 = -iVar4;
        if (iVar9 != iVar5 && SBORROW4(iVar9,iVar5) == iVar9 + iVar4 < 0) {
          iVar5 = iVar9;
        }
        if (iVar4 < iVar9) {
          iVar5 = iVar4;
        }
        iVar4 = (uint)pu1_src[uVar8] - iVar5;
        if (iVar4 < 1) {
          iVar4 = 0;
        }
        if (0xfe < iVar4) {
          iVar4 = 0xff;
        }
        if (filter_flag_p != 0) {
          iVar5 = iVar5 + (uint)pu1_src[uVar8 - lVar6];
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          pu1_src[uVar8 - lVar6] = (UWORD8)iVar5;
        }
        if (filter_flag_q != 0) {
          pu1_src[uVar8] = (UWORD8)iVar4;
        }
        uVar8 = uVar8 + 1;
      } while ((int)uVar8 != 8);
    }
    return;
  }
  __assert_fail("(filter_flag_p || filter_flag_q)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/ihevc_deblk_edge_filter.c"
                ,0x2dc,
                "void ihevc_deblk_chroma_horz(UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
               );
}

Assistant:

void ihevc_deblk_chroma_horz(UWORD8 *pu1_src,
                             WORD32 src_strd,
                             WORD32 quant_param_p,
                             WORD32 quant_param_q,
                             WORD32 qp_offset_u,
                             WORD32 qp_offset_v,
                             WORD32 tc_offset_div2,
                             WORD32 filter_flag_p,
                             WORD32 filter_flag_q)
{
    WORD32 qp_indx_u, qp_chroma_u;
    WORD32 qp_indx_v, qp_chroma_v;
    WORD32 tc_indx_u, tc_u;
    WORD32 tc_indx_v, tc_v;
    WORD32 tc;

    WORD32 delta, tmp_p0, tmp_q0;
    WORD32 col;

    ASSERT(filter_flag_p || filter_flag_q);

    /* chroma processing is done only if BS is 2             */
    /* this function is assumed to be called only if BS is 2 */
    qp_indx_u = qp_offset_u + ((quant_param_p + quant_param_q + 1) >> 1);
    qp_chroma_u = qp_indx_u < 0 ? qp_indx_u : (qp_indx_u > 57 ? qp_indx_u - 6 : gai4_ihevc_qp_table[qp_indx_u]);

    qp_indx_v = qp_offset_v + ((quant_param_p + quant_param_q + 1) >> 1);
    qp_chroma_v = qp_indx_v < 0 ? qp_indx_v : (qp_indx_v > 57 ? qp_indx_v - 6 : gai4_ihevc_qp_table[qp_indx_v]);

    tc_indx_u = CLIP3(qp_chroma_u + 2 + (tc_offset_div2 << 1), 0, 53);
    tc_u = gai4_ihevc_tc_table[tc_indx_u];

    tc_indx_v = CLIP3(qp_chroma_v + 2 + (tc_offset_div2 << 1), 0, 53);
    tc_v = gai4_ihevc_tc_table[tc_indx_v];

    if(0 == tc_u && 0 == tc_v)
    {
        return;
    }

    for(col = 0; col < 8; col++)
    {
        tc = (col & 1) ? tc_v : tc_u;
        delta = CLIP3((((pu1_src[0 * src_strd] -
                      pu1_src[-1 * src_strd]) << 2) +
                      pu1_src[-2 * src_strd] -
                      pu1_src[1 * src_strd] + 4) >> 3,
                      -tc, tc);

        tmp_p0 = CLIP_U8(pu1_src[-1 * src_strd] + delta);
        tmp_q0 = CLIP_U8(pu1_src[0 * src_strd] - delta);

        if(filter_flag_p != 0)
        {
            pu1_src[-1 * src_strd] = tmp_p0;
        }

        if(filter_flag_q != 0)
        {
            pu1_src[0 * src_strd] = tmp_q0;
        }

        pu1_src += 1;
    }

}